

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O0

int http_EndHttpRequest(void *Handle,int timeout)

{
  size_t bufsize;
  http_connection_handle_t *handle;
  char *zcrlf;
  int retc;
  int timeout_local;
  void *Handle_local;
  
  zcrlf._0_4_ = 0;
  if (Handle == (void *)0x0) {
    Handle_local._4_4_ = -0x65;
  }
  else if (*(int *)((long)Handle + 0x280) == 0) {
    Handle_local._4_4_ = 0;
  }
  else {
    *(undefined4 *)((long)Handle + 0x280) = 0;
    if (*(int *)((long)Handle + 0x88) == -3) {
      zcrlf._4_4_ = timeout;
      _retc = Handle;
      bufsize = strlen("0\r\n\r\n");
      zcrlf._0_4_ = sock_write((SOCKINFO *)Handle,"0\r\n\r\n",bufsize,(int *)((long)&zcrlf + 4));
    }
    Handle_local._4_4_ = -0xc9;
    if (-1 < (int)zcrlf) {
      Handle_local._4_4_ = 0;
    }
  }
  return Handle_local._4_4_;
}

Assistant:

int http_EndHttpRequest(void *Handle, int timeout)
{
	int retc = 0;
	const char *zcrlf = "0\r\n\r\n";
	http_connection_handle_t *handle = Handle;
	if (!handle)
		return UPNP_E_INVALID_PARAM;
	if (!handle->requestStarted) {
		return UPNP_E_SUCCESS;
	}
	handle->requestStarted = 0;
	if (handle->contentLength == UPNP_USING_CHUNKED)
		/*send last chunk */
		retc = sock_write(
			&handle->sock_info, zcrlf, strlen(zcrlf), &timeout);

	return retc >= 0 ? UPNP_E_SUCCESS : UPNP_E_SOCKET_WRITE;
}